

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O1

void init_map(void)

{
  int iVar1;
  GLuint *pGVar2;
  GLuint GVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  
  fVar8 = 0.0;
  iVar1 = 0;
  iVar5 = 0;
  do {
    lVar4 = (long)iVar5 * 4;
    lVar6 = 0;
    fVar9 = 0.0;
    do {
      map_vertices[0][iVar5 + lVar6] = fVar8;
      *(undefined4 *)(lVar4 + 0x11baa0 + lVar6 * 4) = 0;
      *(float *)(lVar4 + 0x121ea0 + lVar6 * 4) = fVar9;
      fVar9 = fVar9 + 0.12658228;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 0x50);
    iVar5 = iVar5 + 0x50;
    fVar8 = fVar8 + 0.12658228;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x50);
  pGVar2 = map_line_indices + 1;
  GVar3 = 0x9f;
  do {
    pGVar2[-1] = GVar3 - 0x50;
    *pGVar2 = GVar3;
    pGVar2 = pGVar2 + 2;
    GVar3 = GVar3 + 0x50;
  } while (GVar3 != 0x194f);
  lVar4 = 0;
  do {
    map_line_indices[lVar4 * 2 + 0x9e] = (int)lVar4 + 0x18b0;
    map_line_indices[lVar4 * 2 + 0x9f] = (int)lVar4 + 0x18b1;
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 0x4f);
  lVar4 = 0x13c;
  iVar1 = 0;
  iVar5 = 0;
  do {
    lVar4 = (long)(int)lVar4;
    iVar7 = 0;
    do {
      GVar3 = iVar1 + iVar7;
      map_line_indices[lVar4] = GVar3;
      map_line_indices[lVar4 + 1] = iVar1 + iVar7 + 1;
      map_line_indices[lVar4 + 2] = GVar3;
      map_line_indices[lVar4 + 3] = iVar1 + 0x50 + iVar7;
      map_line_indices[lVar4 + 4] = GVar3;
      map_line_indices[lVar4 + 5] = iVar1 + iVar7 + 0x51;
      lVar4 = lVar4 + 6;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x4f);
    iVar5 = iVar5 + 1;
    iVar1 = iVar1 + 0x50;
  } while (iVar5 != 0x4f);
  return;
}

Assistant:

static void init_map(void)
{
    int i;
    int j;
    int k;
    GLfloat step = MAP_SIZE / (MAP_NUM_VERTICES - 1);
    GLfloat x = 0.0f;
    GLfloat z = 0.0f;
    /* Create a flat grid */
    k = 0;
    for (i = 0 ; i < MAP_NUM_VERTICES ; ++i)
    {
        for (j = 0 ; j < MAP_NUM_VERTICES ; ++j)
        {
            map_vertices[0][k] = x;
            map_vertices[1][k] = 0.0f;
            map_vertices[2][k] = z;
            z += step;
            ++k;
        }
        x += step;
        z = 0.0f;
    }
#if DEBUG_ENABLED
    for (i = 0 ; i < MAP_NUM_TOTAL_VERTICES ; ++i)
    {
        printf ("Vertice %d (%f, %f, %f)\n",
                i, map_vertices[0][i], map_vertices[1][i], map_vertices[2][i]);

    }
#endif
    /* create indices */
    /* line fan based on i
     * i+1
     * |  / i + n + 1
     * | /
     * |/
     * i --- i + n
     */

    /* close the top of the square */
    k = 0;
    for (i = 0 ; i < MAP_NUM_VERTICES  -1 ; ++i)
    {
        map_line_indices[k++] = (i + 1) * MAP_NUM_VERTICES -1;
        map_line_indices[k++] = (i + 2) * MAP_NUM_VERTICES -1;
    }
    /* close the right of the square */
    for (i = 0 ; i < MAP_NUM_VERTICES -1 ; ++i)
    {
        map_line_indices[k++] = (MAP_NUM_VERTICES - 1) * MAP_NUM_VERTICES + i;
        map_line_indices[k++] = (MAP_NUM_VERTICES - 1) * MAP_NUM_VERTICES + i + 1;
    }

    for (i = 0 ; i < (MAP_NUM_VERTICES - 1) ; ++i)
    {
        for (j = 0 ; j < (MAP_NUM_VERTICES - 1) ; ++j)
        {
            int ref = i * (MAP_NUM_VERTICES) + j;
            map_line_indices[k++] = ref;
            map_line_indices[k++] = ref + 1;

            map_line_indices[k++] = ref;
            map_line_indices[k++] = ref + MAP_NUM_VERTICES;

            map_line_indices[k++] = ref;
            map_line_indices[k++] = ref + MAP_NUM_VERTICES + 1;
        }
    }

#ifdef DEBUG_ENABLED
    for (k = 0 ; k < 2 * MAP_NUM_LINES ; k += 2)
    {
        int beg, end;
        beg = map_line_indices[k];
        end = map_line_indices[k+1];
        printf ("Line %d: %d -> %d (%f, %f, %f) -> (%f, %f, %f)\n",
                k / 2, beg, end,
                map_vertices[0][beg], map_vertices[1][beg], map_vertices[2][beg],
                map_vertices[0][end], map_vertices[1][end], map_vertices[2][end]);
    }
#endif
}